

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

bool __thiscall bloaty::anon_unknown_0::IsObjectFile(anon_unknown_0 *this,string_view data)

{
  bool bVar1;
  bool bVar2;
  string_view data_00;
  string_view data_01;
  ArFile ar;
  ElfFile elf;
  ArFile AStack_138;
  ElfFile local_118;
  
  data_00._M_str = (char *)data._M_len;
  data_00._M_len = (size_t)this;
  ElfFile::ElfFile(&local_118,data_00);
  data_01._M_str = (char *)data._M_len;
  data_01._M_len = (size_t)this;
  ArFile::ArFile(&AStack_138,data_01);
  bVar1 = ArFile::IsOpen(&AStack_138);
  bVar2 = true;
  if (!bVar1) {
    if (local_118.ok_ == true) {
      bVar2 = local_118.header_.e_type == 1;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

static bool IsObjectFile(string_view data) {
  ElfFile elf(data);
  return IsArchiveFile(data) || (elf.IsOpen() && elf.header().e_type == ET_REL);
}